

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::check_frozen_serialization(roaring64_bitmap_t *r1)

{
  size_t a;
  char *expression;
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *r2;
  size_t serialized;
  char *buf;
  size_t serialized_size;
  roaring64_bitmap_t *in_stack_00000070;
  roaring64_bitmap_t *in_stack_00000088;
  roaring64_bitmap_t *in_stack_00000098;
  size_t in_stack_000000e0;
  char *in_stack_000000e8;
  roaring64_bitmap_t *in_stack_00000130;
  roaring64_bitmap_t *in_stack_00000138;
  char *in_stack_00000170;
  roaring64_bitmap_t *in_stack_00000178;
  size_t in_stack_ffffffffffffffd8;
  int iVar2;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  roaring64_bitmap_shrink_to_fit(in_stack_00000088);
  assert_r64_valid(in_stack_ffffffffffffffe0);
  a = roaring64_bitmap_frozen_size_in_bytes(in_stack_00000098);
  expression = (char *)roaring_aligned_malloc
                                 ((size_t)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar2 = (int)(in_stack_ffffffffffffffd8 >> 0x20);
  b = (roaring64_bitmap_t *)roaring64_bitmap_frozen_serialize(in_stack_00000178,in_stack_00000170);
  _assert_int_equal(a,(unsigned_long)expression,(char *)b,iVar2);
  roaring64_bitmap_frozen_view(in_stack_000000e8,in_stack_000000e0);
  _assert_true(a,expression,(char *)b,iVar2);
  memmove(expression,expression + 1,a);
  prVar1 = roaring64_bitmap_frozen_view(in_stack_000000e8,in_stack_000000e0);
  iVar2 = (int)((ulong)prVar1 >> 0x20);
  _assert_true(a,expression,(char *)b,iVar2);
  assert_r64_valid(b);
  roaring64_bitmap_equals(in_stack_00000138,in_stack_00000130);
  _assert_true(a,expression,(char *)b,iVar2);
  roaring64_bitmap_free(in_stack_00000070);
  roaring_aligned_free((void *)0x10a602);
  return;
}

Assistant:

void check_frozen_serialization(roaring64_bitmap_t* r1) {
    roaring64_bitmap_shrink_to_fit(r1);
    assert_r64_valid(r1);

    // Serialize to an unaligned buffer, deserialize from an 32-byte aligned
    // buffer.
    size_t serialized_size = roaring64_bitmap_frozen_size_in_bytes(r1);
    char* buf = (char*)roaring_aligned_malloc(64, serialized_size + 1);
    size_t serialized = roaring64_bitmap_frozen_serialize(r1, buf + 1);
    assert_int_equal(serialized, serialized_size);
    // Cannot deserialize from an unaligned buffer.
    assert_null(roaring64_bitmap_frozen_view(buf + 1, serialized_size));
    memmove(buf, buf + 1, serialized_size);

    roaring64_bitmap_t* r2 = roaring64_bitmap_frozen_view(buf, serialized_size);
    assert_non_null(r2);
    assert_r64_valid(r2);
    assert_true(roaring64_bitmap_equals(r2, r1));

    roaring64_bitmap_free(r2);
    roaring_aligned_free(buf);
}